

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O1

void CVmPack::unpack_iter_item
               (CVmPackPos *p,CVmObjList *retlst,int *retcnt,CVmPackGroup *group,int *prefix_count)

{
  CVmDataSource *src;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  wchar_t wVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined4 extraout_var_04;
  long lVar6;
  byte *pbVar7;
  utf8_ptr p_00;
  byte *pbVar8;
  CVmPackPos p_1;
  CVmPackType t;
  CVmPackPos local_98;
  CVmPackType local_80;
  
  local_80.lit.idx = 0;
  local_80.lit.p.p_ = (char *)0x0;
  local_80.lit.len = 0;
  local_80.type_code = L'\0';
  local_80.big_endian = 0;
  local_80.count = -1;
  local_80.count_in_bytes = 0;
  local_80.count_as_type = L'\0';
  local_80.up_to_count = 0;
  local_80.bang = 0;
  local_80.tilde = 0;
  local_80.pct = 0;
  local_80.qu = 0;
  local_80.null_term = 0;
  local_80.fmtidx = 0;
  parse_type(p,&local_80,group);
  src = group->ds;
  bVar1 = true;
  if (local_80.type_code < L'a') {
    if (local_80.type_code < L'H') {
      if (local_80.type_code == L'\"') {
        iVar2 = 0;
        p_00.p_ = local_80.lit.p.p_;
        pbVar8 = (byte *)local_80.lit.len;
        while (pbVar8 != (byte *)0x0) {
          wVar5 = utf8_ptr::s_getch(p_00.p_);
          pbVar7 = (byte *)p_00.p_;
          if (wVar5 == L'\"') {
            pbVar7 = (byte *)p_00.p_ +
                     (ulong)((((byte)*p_00.p_ >> 5 & 1) != 0) + 1 & (uint)((byte)*p_00.p_ >> 7) * 3)
                     + 1;
            pbVar8 = (byte *)p_00.p_ + ((long)pbVar8 - (long)pbVar7);
          }
          p_00.p_ = (char *)pbVar7;
          if (pbVar8 != (byte *)0x0) {
            p_00.p_ = (char *)(pbVar7 + (ulong)(((*pbVar7 >> 5 & 1) != 0) + 1 &
                                               (uint)(*pbVar7 >> 7) * 3) + 1);
            pbVar8 = pbVar7 + ((long)pbVar8 - (long)p_00.p_);
          }
          iVar2 = iVar2 + 1;
        }
        iVar3 = local_80.count;
        if (local_80.count < 0) {
          iVar3 = 1;
        }
        iVar2 = iVar3 * iVar2;
        goto LAB_0027dd6a;
      }
      if (local_80.type_code == L'@') {
        if (local_80.qu == 0) {
          if (local_80.bang == 0) {
            lVar6 = group->stream_ofs;
          }
          else {
            lVar6 = CVmPackGroup::root_stream_ofs(group);
          }
          iVar2 = local_80.count;
          if (local_80.count < 0) {
            iVar2 = 1;
          }
          iVar3 = (*src->_vptr_CVmDataSource[7])(src);
          lVar6 = (iVar2 + lVar6) - CONCAT44(extraout_var_04,iVar3);
          UNRECOVERED_JUMPTABLE = src->_vptr_CVmDataSource[8];
          goto LAB_0027dd77;
        }
        goto LAB_0027dcf6;
      }
      if (local_80.type_code == L'A') goto switchD_0027da4f_caseD_75;
    }
    else if (local_80.type_code < L'W') {
      if ((local_80.type_code == L'H') || (local_80.type_code == L'U'))
      goto switchD_0027da4f_caseD_75;
    }
    else {
      if (local_80.type_code == L'W') goto switchD_0027da4f_caseD_75;
      if (local_80.type_code == L'X') {
        if (local_80.bang != 0) {
          iVar2 = -1;
          goto LAB_0027dab5;
        }
        iVar2 = local_80.count;
        if (local_80.count < 0) {
          iVar2 = 1;
        }
        iVar2 = -iVar2;
        goto LAB_0027dd6a;
      }
    }
  }
  else {
    switch(local_80.type_code) {
    case L'u':
    case L'w':
switchD_0027da4f_caseD_75:
      bVar1 = false;
      break;
    case L'v':
    case L'y':
    case L'z':
      break;
    case L'x':
      if (local_80.bang == 0) {
        iVar2 = local_80.count;
        if (local_80.count < 0) {
          iVar2 = 1;
        }
      }
      else {
        iVar2 = 1;
LAB_0027dab5:
        iVar2 = alignment_padding(&local_80,group,iVar2);
      }
LAB_0027dd6a:
      lVar6 = (long)iVar2;
      UNRECOVERED_JUMPTABLE = src->_vptr_CVmDataSource[8];
LAB_0027dd77:
      (*UNRECOVERED_JUMPTABLE)(src,lVar6,1);
      return;
    case L'{':
      local_98.p.p_ = local_80.lit.p.p_;
      local_98.len = local_80.lit.len;
      local_98.idx = local_80.lit.idx;
      CVmPackPos::getch(&local_98);
      iVar2 = 0;
      while ((byte *)local_98.len != (byte *)0x0) {
        pbVar8 = (byte *)local_98.p.p_ +
                 (ulong)((((byte)*local_98.p.p_ >> 5 & 1) != 0) + 1 &
                        (uint)((byte)*local_98.p.p_ >> 7) * 3) + 1;
        local_98.len = (size_t)((byte *)local_98.p.p_ + (local_98.len - (long)pbVar8));
        local_98.p.p_ = (char *)pbVar8;
        iVar3 = local_98.idx + 1;
        if ((byte *)local_98.len != (byte *)0x0) {
          local_98.p.p_ =
               (char *)(pbVar8 + (ulong)(((*pbVar8 >> 5 & 1) != 0) + 1 & (uint)(*pbVar8 >> 7) * 3) +
                                 1);
          local_98.len = (size_t)(pbVar8 + (local_98.len - (long)local_98.p.p_));
          iVar3 = local_98.idx + 2;
        }
        local_98.idx = iVar3;
        CVmPackPos::getch(&local_98);
        iVar2 = iVar2 + 1;
      }
      iVar3 = local_80.count;
      if (local_80.count < 0) {
        iVar3 = 1;
      }
      (*src->_vptr_CVmDataSource[8])(src,(long)(iVar3 * iVar2),1);
      return;
    default:
      if (((uint)(local_80.type_code + L'\xffffff9f') < 2) || (local_80.type_code == L'h'))
      goto switchD_0027da4f_caseD_75;
    }
  }
  if (prefix_count != (int *)0x0) {
    local_80.count = *prefix_count;
  }
  iVar2 = local_80.count;
  if (bVar1) {
    if (local_80.count == -2) {
      iVar2 = (*src->_vptr_CVmDataSource[6])(src);
      iVar3 = (*src->_vptr_CVmDataSource[7])(src);
      if (CONCAT44(extraout_var,iVar2) <= CONCAT44(extraout_var_00,iVar3)) {
        return;
      }
      do {
        unpack_into_list(retlst,retcnt,src,&local_80,group);
        iVar3 = (*src->_vptr_CVmDataSource[7])(src);
      } while (CONCAT44(extraout_var_01,iVar3) < CONCAT44(extraout_var,iVar2));
      return;
    }
    if (local_80.up_to_count != 0) {
      iVar4 = (*src->_vptr_CVmDataSource[6])(src);
      iVar3 = 1;
      if (-1 < iVar2) {
        iVar3 = iVar2;
      }
      if (iVar3 < 1) {
        return;
      }
      do {
        iVar2 = (*src->_vptr_CVmDataSource[7])(src);
        if (CONCAT44(extraout_var_02,iVar4) <= CONCAT44(extraout_var_03,iVar2)) {
          return;
        }
        unpack_into_list(retlst,retcnt,src,&local_80,group);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      return;
    }
    iVar2 = 1;
    if (-1 < local_80.count) {
      iVar2 = local_80.count;
    }
    if (iVar2 < 1) {
      return;
    }
    do {
      unpack_into_list(retlst,retcnt,src,&local_80,group);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    return;
  }
LAB_0027dcf6:
  unpack_into_list(retlst,retcnt,src,&local_80,group);
  return;
}

Assistant:

void CVmPack::unpack_iter_item(VMG_ CVmPackPos *p,
                               CVmObjList *retlst, int &retcnt,
                               CVmPackGroup *group, const int *prefix_count)
{
    int len;
    
    /* parse the template item */
    CVmPackType t;
    parse_type(p, &t, group);

    /* get the data source */
    CVmDataSource *src = group->ds;

    /* check for non-value types and string types */
    int is_string_type = FALSE;
    switch (t.type_code)
    {
    case 'x':
        /* Nul bytes: on input, just skip bytes */
        if (t.bang)
            src->seek(alignment_padding(&t, group, 1), OSFSK_CUR);
        else
            src->seek(t.get_count(), OSFSK_CUR);
        return;

    case 'X':
        /* back up by 'count' bytes */
        if (t.bang)
            src->seek(alignment_padding(&t, group, -1), OSFSK_CUR);
        else
            src->seek(-t.get_count(), OSFSK_CUR);
        return;

    case '"':
        /* count the characters in the string */
        len = 0;
        for (CVmPackPos p(&t.lit) ; p.len != 0 ; p.inc(), ++len)
        {
            /* if this is a quote, it must be stuttered, so skip it */
            if (p.getch_raw() == '"')
                p.inc();
        }

        /* skip the bytes, and we're done */
        src->seek(len * t.get_count(), OSFSK_CUR);
        return;

    case '{':
        /* count the hex digit pairs */
        len = 0;
        for (CVmPackPos p(&t.lit) ; p.more() ; ++len, p.inc(), p.inc()) ;

        /* skip the bytes, and we're done */
        src->seek(len * t.get_count(), OSFSK_CUR);
        return;

    case '@':
        /* seek to position or retrieve current position */
        if (t.qu)
        {
            /* @? retrieves the current position as an output value */
            unpack_into_list(vmg_ retlst, retcnt, src, &t, group);
        }
        else
        {
            /* 
             *   Absolute positioning: seek to the starting position plus the
             *   specified offset.  The starting position is the current
             *   group's starting position, or the whole string's start if
             *   the !  qualifier is present.  
             */
            src->seek((t.bang ? group->root_stream_ofs() : group->stream_ofs)
                      + t.get_count() - src->get_pos(),
                      OSFSK_CUR);
        }
        return;

    case 'a':
    case 'A':
    case 'b':
    case 'u':
    case 'U':
    case 'w':
    case 'W':
    case 'h':
    case 'H':
        /* make a note that this is a string type */
        is_string_type = TRUE;
        break;
    }

    /*
     *   We have a regular unpacking type (not one of the special positioning
     *   codes).  If there's a prefix count, it overrides any count specified
     *   in the type.  
     */
    if (prefix_count != 0)
        t.count = *prefix_count;

    /* 
     *   If it's a string type, the repeat count specifies the length of the
     *   string in the file (in bytes, characters, nibbles, or other units
     *   that vary by template type).  Otherwise, the repeat count is the
     *   number of copies of the item to unpack.  
     */
    if (is_string_type)
    {
        /* 
         *   It's a string type.  The count doesn't specify the number of
         *   strings to write, but rather specifies the number of bytes to
         *   read into one string.  
         */
        unpack_into_list(vmg_ retlst, retcnt, src, &t, group);
    }
    else if (t.count == ITER_STAR)
    {
        /* unpack this item repeatedly until we run out of source */
        long src_size = src->get_size();
        while (src->get_pos() < src_size)
            unpack_into_list(vmg_ retlst, retcnt, src, &t, group);
    }
    else if (t.up_to_count)
    {
        /* 
         *   unpack this item the number of times given by the repeat count,
         *   but stop if we reach EOF first
         */
        long src_size = src->get_size();
        for (int i = 0 ; i < t.get_count() && src->get_pos() < src_size ; ++i)
            unpack_into_list(vmg_ retlst, retcnt, src, &t, group);
    }
    else
    {
        /* unpack this item the number of times given by the repeat count */
        for (int i = 0 ; i < t.get_count() ; ++i)
            unpack_into_list(vmg_ retlst, retcnt, src, &t, group);
    }
}